

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *vArr1;
  Vec_Int_t *vArr2;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  uint Entry;
  int *piVar18;
  
  piVar4 = vPart0->pArray;
  piVar17 = vPart1->pArray;
  iVar3 = vPart0->nSize;
  iVar6 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  piVar1 = piVar17 + iVar6;
  piVar5 = piVar4;
  piVar18 = piVar4;
  do {
    while( true ) {
      piVar13 = piVar17;
      piVar12 = piVar5;
      piVar18 = piVar18 + 1;
      if ((piVar4 + iVar3 <= piVar12) || (piVar1 <= piVar13)) {
        return;
      }
      iVar6 = Fx_ManGetCubeVar(vCubes,*piVar12);
      iVar7 = Fx_ManGetCubeVar(vCubes,*piVar13);
      piVar17 = piVar13;
      if (iVar6 == iVar7) break;
      if (iVar6 < iVar7) {
        piVar5 = piVar12 + 1;
      }
      else {
        piVar5 = piVar12;
        piVar18 = piVar12;
        piVar17 = piVar13 + 1;
      }
    }
    lVar15 = 1;
    while ((piVar18 < piVar4 + iVar3 && (iVar7 = Fx_ManGetCubeVar(vCubes,*piVar18), iVar6 == iVar7))
          ) {
      lVar15 = lVar15 + 1;
      piVar18 = piVar18 + 1;
    }
    lVar11 = 1;
    while ((piVar17 = piVar17 + 1, piVar17 < piVar1 &&
           (iVar7 = Fx_ManGetCubeVar(vCubes,*piVar17), iVar6 == iVar7))) {
      lVar11 = lVar11 + 1;
    }
    for (lVar14 = 0; piVar5 = piVar18, lVar15 != lVar14; lVar14 = lVar14 + 1) {
      for (lVar16 = 0; lVar11 != lVar16; lVar16 = lVar16 + 1) {
        if (piVar12[lVar14] != piVar13[lVar16]) {
          vArr1 = Vec_WecEntry(vCubes,piVar12[lVar14]);
          vArr2 = Vec_WecEntry(vCubes,piVar13[lVar16]);
          Fx_ManDivFindCubeFree(vArr1,vArr2,vCubeFree,fWarning);
          uVar8 = vCubeFree->nSize;
          Entry = 0;
          if (uVar8 == 4) {
            iVar6 = Fx_ManDivNormalize(vCubeFree);
            Entry = (uint)(iVar6 == 1);
            uVar8 = vCubeFree->nSize;
          }
          if (vDiv->nSize == uVar8) {
            uVar9 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar9 = 0;
            }
            uVar10 = 0;
            do {
              if (uVar9 == uVar10) {
                Vec_IntPush(vPairs,piVar12[lVar14]);
                Vec_IntPush(vPairs,piVar13[lVar16]);
                Vec_IntPush(vCompls,Entry);
                break;
              }
              piVar5 = vDiv->pArray + uVar10;
              piVar2 = vCubeFree->pArray + uVar10;
              uVar10 = uVar10 + 1;
            } while (*piVar5 == *piVar2);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}